

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cxx
# Opt level: O1

void __thiscall cmsys::Glob::AddExpression(Glob *this,string *expr)

{
  GlobInternals *pGVar1;
  string local_108;
  RegularExpression local_e8;
  
  pGVar1 = this->Internals;
  PatternToRegex(&local_108,expr,true,false);
  local_e8.regmatch.startp[0] = (char *)0x0;
  local_e8.regmatch.endp[0] = (char *)0x0;
  local_e8.regmatch.searchstring = (char *)0x0;
  local_e8.program = (char *)0x0;
  RegularExpression::compile(&local_e8,local_108._M_dataplus._M_p);
  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::
  emplace_back<cmsys::RegularExpression>(&pGVar1->Expressions,&local_e8);
  if (local_e8.program != (char *)0x0) {
    operator_delete__(local_e8.program);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Glob::AddExpression(const std::string& expr)
{
  this->Internals->Expressions.push_back(
    kwsys::RegularExpression(this->PatternToRegex(expr)));
}